

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateRankExists(Result *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ == 0) ||
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ == 0)) {
    std::__cxx11::string::string
              ((string *)&local_30,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_70,"Layer \'",&local_30);
    std::operator+(&err,&local_70,"\' must have rank specified for its input and output.");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRankExists(const Specification::NeuralNetworkLayer& layer) {

    if (layer.inputtensor_size() == 0 || layer.outputtensor_size() == 0) {
        std::string err = "Layer '" + std::string(layer.name()) + "' must have rank specified for its input and output.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}